

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

int __thiscall asl::Array<asl::WebSocket_*>::dup(Array<asl::WebSocket_*> *this,int __fd)

{
  WebSocket **ppWVar1;
  WebSocket **in_RAX;
  int in_ECX;
  void *in_RDX;
  void *in_R8;
  Array<asl::WebSocket_*> local_18;
  
  if (*(int *)(this->_a + -1) != 1) {
    local_18._a = in_RAX;
    clone(&local_18,(__fn *)this,in_RDX,in_ECX,in_R8);
    if (this->_a != local_18._a) {
      LOCK();
      ppWVar1 = this->_a + -1;
      *(int *)ppWVar1 = *(int *)ppWVar1 + -1;
      UNLOCK();
      if (*(int *)ppWVar1 == 0) {
        free(this->_a + -2);
        this->_a = (WebSocket **)0x0;
      }
      this->_a = (WebSocket **)local_18;
      LOCK();
      *(int *)(local_18._a + -1) = *(int *)(local_18._a + -1) + 1;
      UNLOCK();
    }
    LOCK();
    ppWVar1 = local_18._a + -1;
    *(int *)ppWVar1 = *(int *)ppWVar1 + -1;
    UNLOCK();
    if (*(int *)ppWVar1 == 0) {
      free(local_18._a + -2);
    }
  }
  return (int)this;
}

Assistant:

Array& dup()
	{
		if(d().rc==1) return *this;
		return (*this = clone());
	}